

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O1

optional<pbrt::RGB> __thiscall
pbrt::ParameterDictionary::GetOneRGB(ParameterDictionary *this,string *name)

{
  double dVar1;
  memory_resource *pmVar2;
  long lVar3;
  char *pcVar4;
  undefined1 (*pauVar5) [16];
  undefined1 auVar6 [16];
  int iVar7;
  undefined8 *in_RDX;
  undefined8 *extraout_RDX;
  undefined8 *extraout_RDX_00;
  undefined8 *__n;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar8;
  long lVar9;
  bool bVar10;
  optional<pbrt::RGB> oVar11;
  
  lVar3 = *(long *)((long)&name[2].field_2 + 8);
  paVar8 = &name->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)name->_M_string_length !=
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)0x0) {
    paVar8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)name->_M_string_length;
  }
  bVar10 = lVar3 == 0;
  __n = in_RDX;
  if (!bVar10) {
    lVar9 = 0;
    do {
      pcVar4 = *(char **)((long)paVar8 + lVar9);
      __n = *(undefined8 **)(pcVar4 + 0x28);
      if ((__n == (undefined8 *)in_RDX[1]) &&
         (((__n == (undefined8 *)0x0 ||
           (iVar7 = bcmp((((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          (pcVar4 + 0x20))->_M_dataplus)._M_p,(void *)*in_RDX,(size_t)__n),
           __n = extraout_RDX, iVar7 == 0)) &&
          (iVar7 = std::__cxx11::string::compare(pcVar4), __n = extraout_RDX_00, iVar7 == 0)))) {
        if (*(ulong *)(pcVar4 + 0x70) < 3) {
          ErrorExit<std::__cxx11::string_const&>
                    ((FileLoc *)(pcVar4 + 0x40),"Insufficient values for \"rgb\" parameter \"%s\".",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (pcVar4 + 0x20));
        }
        pauVar5 = *(undefined1 (**) [16])(pcVar4 + 0x60);
        dVar1 = *(double *)pauVar5[1];
        *(undefined1 *)((long)&(this->params).ptr + 4) = 1;
        auVar6 = vcvtpd2ps_avx(*pauVar5);
        pmVar2 = (memory_resource *)vmovlps_avx(auVar6);
        (this->params).alloc.memoryResource = pmVar2;
        *(float *)&(this->params).ptr = (float)dVar1;
        if (!bVar10) goto LAB_0031e539;
        break;
      }
      lVar9 = lVar9 + 8;
      bVar10 = lVar3 << 3 == lVar9;
    } while (!bVar10);
  }
  (this->params).alloc.memoryResource = (memory_resource *)0x0;
  (this->params).ptr = (ParsedParameter **)0x0;
LAB_0031e539:
  oVar11._8_8_ = __n;
  oVar11.optionalValue._0_8_ = this;
  return oVar11;
}

Assistant:

pstd::optional<RGB> ParameterDictionary::GetOneRGB(const std::string &name) const {
    for (const ParsedParameter *p : params) {
        if (p->name == name && p->type == "rgb") {
            if (p->numbers.size() < 3)
                ErrorExit(&p->loc, "Insufficient values for \"rgb\" parameter \"%s\".",
                          p->name);
            return RGB(p->numbers[0], p->numbers[1], p->numbers[2]);
        }
    }
    return {};
}